

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

void glfwSetCursor(GLFWwindow *windowHandle,GLFWcursor *cursorHandle)

{
  _GLFWcursor *cursor;
  _GLFWwindow *window;
  
  if (windowHandle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/build_O2/_deps/glfw-src/src/input.c"
                  ,0x34b,"void glfwSetCursor(GLFWwindow *, GLFWcursor *)");
  }
  if (_glfw.initialized != 0) {
    *(GLFWcursor **)(windowHandle + 0x50) = cursorHandle;
    _glfwPlatformSetCursor((_GLFWwindow *)windowHandle,(_GLFWcursor *)cursorHandle);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetCursor(GLFWwindow* windowHandle, GLFWcursor* cursorHandle)
{
    _GLFWwindow* window = (_GLFWwindow*) windowHandle;
    _GLFWcursor* cursor = (_GLFWcursor*) cursorHandle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    window->cursor = cursor;

    _glfwPlatformSetCursor(window, cursor);
}